

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
 __thiscall
Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
insert_node_<false,true,false,double_const&>
          (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *this,Siblings *sib,
          Vertex_handle v,double *filtration_value)

{
  node_ptr pcVar1;
  bool bVar2;
  reference ppVar3;
  Siblings *pSVar4;
  undefined4 in_register_00000014;
  ulong extraout_RDX;
  ulong uVar5;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
  pVar6;
  Vertex_handle v_local;
  Siblings *sib_local;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
  local_18;
  
  sib_local = (Siblings *)CONCAT44(in_register_00000014,v);
  v_local = (Vertex_handle)filtration_value;
  boost::container::
  map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>,std::less<int>,void,void>
  ::
  try_emplace<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,boost::container::map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>,std::less<int>,void,void>>*&,double_const&>
            ((map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>,std::less<int>,void,void>
              *)this,(key_type *)&sib_local->members_,
             (Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
              **)&v_local,(double *)&sib_local);
  local_18.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(this->nodes_label_to_list_)._M_h._M_buckets;
  bVar2 = has_children<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,false>>
                    ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)sib,&local_18);
  uVar5 = extraout_RDX;
  if (!bVar2) {
    ppVar3 = boost::container::dtl::
             iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
             ::operator*((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
                          *)this);
    pSVar4 = (Siblings *)operator_new(0x30);
    uVar5 = (ulong)(uint)v_local;
    pSVar4->oncles_ = sib_local;
    pSVar4->parent_ = v_local;
    pcVar1 = (node_ptr)
             ((long)&(pSVar4->members_).
                     super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
                     .
                     super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                     .m_icont.
                     super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                     .
                     super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                     .
                     super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
             + 8);
    *(node_ptr *)
     ((long)&(pSVar4->members_).
             super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
             .
             super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
             .m_icont.
             super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
             .
             super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
             .
             super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
     + 0x10) = pcVar1;
    *(node_ptr *)
     ((long)&(pSVar4->members_).
             super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
             .
             super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
             .m_icont.
             super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
             .
             super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
             .
             super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
     + 0x18) = pcVar1;
    (pSVar4->members_).
    super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
    .
    super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
    .m_icont.
    super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .super_size_holder<true,_unsigned_long,_void> = 0;
    (((bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
       *)((long)&(pSVar4->members_).
                 super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
                 .
                 super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                 .m_icont.
                 super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                 .
                 super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                 .
                 super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
         + 8))->
    super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
    ).holder.root.super_node.parent_ = (node_ptr)0x0;
    (ppVar3->second).children_ = pSVar4;
  }
  pVar6._8_8_ = uVar5;
  pVar6.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar6;
}

Assistant:

std::pair<Dictionary_it, bool> insert_node_(Siblings *sib, Vertex_handle v, Filt&& filtration_value) {
    std::pair<Dictionary_it, bool> ins = sib->members_.try_emplace(v, sib, std::forward<Filt>(filtration_value));

    if constexpr (update_children){
      if (!(has_children(ins.first))) {
        ins.first->second.assign_children(new Siblings(sib, v));
      }
    }

    if (ins.second){
      // Only required when insertion is successful
      update_simplex_tree_after_node_insertion(ins.first);
      return ins;
    }

    if constexpr (Options::store_filtration && update_fil){
      if (unify_lifetimes(ins.first->second.filtration(), filtration_value)) return ins;
    }

    if constexpr (set_to_null){
      ins.first = Dictionary_it();
    }

    return ins;
  }